

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int io_open(lua_State *L)

{
  int iVar1;
  char *__filename;
  char *mode_00;
  LStream *pLVar2;
  int *piVar3;
  FILE *pFVar4;
  int local_34;
  char *md;
  LStream *p;
  char *mode;
  char *filename;
  lua_State *L_local;
  
  __filename = luaL_checklstring(L,1,(size_t *)0x0);
  mode_00 = luaL_optlstring(L,2,"r",(size_t *)0x0);
  pLVar2 = newfile(L);
  iVar1 = l_checkmode(mode_00);
  if (iVar1 == 0) {
    luaL_argerror(L,2,"invalid mode");
  }
  piVar3 = __errno_location();
  *piVar3 = 0;
  pFVar4 = fopen64(__filename,mode_00);
  pLVar2->f = (FILE *)pFVar4;
  if (pLVar2->f == (FILE *)0x0) {
    local_34 = luaL_fileresult(L,0,__filename);
  }
  else {
    local_34 = 1;
  }
  return local_34;
}

Assistant:

static int io_open (lua_State *L) {
  const char *filename = luaL_checkstring(L, 1);
  const char *mode = luaL_optstring(L, 2, "r");
  LStream *p = newfile(L);
  const char *md = mode;  /* to traverse/check mode */
  luaL_argcheck(L, l_checkmode(md), 2, "invalid mode");
  errno = 0;
  p->f = fopen(filename, mode);
  return (p->f == NULL) ? luaL_fileresult(L, 0, filename) : 1;
}